

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::insert
          (SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this,InplaceStr *key,
          VariableData **value)

{
  Node *pNVar1;
  InplaceStr key_00;
  bool bVar2;
  ulong uVar3;
  InplaceStr local_70;
  Node *local_60;
  Node *item;
  VariableData *pVStack_50;
  uint i;
  VariableData *local_48;
  InplaceStrHasher local_39;
  uint local_38;
  uint local_34;
  uint bucket;
  uint bucketMask;
  VariableData **local_20;
  VariableData **value_local;
  InplaceStr *key_local;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this_local;
  
  local_20 = value;
  value_local = (VariableData **)key;
  key_local = (InplaceStr *)this;
  InplaceStr::InplaceStr((InplaceStr *)&bucket);
  bVar2 = InplaceStr::operator!=(key,(InplaceStr *)&bucket);
  if (!bVar2) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<InplaceStr, VariableData *, InplaceStrHasher, 128>::insert(const Key &, const Value &) [Key = InplaceStr, Value = VariableData *, Hasher = InplaceStrHasher, N = 128]"
                 );
  }
  if (this->bucketCount <= this->count + (this->count >> 2)) {
    rehash(this);
  }
  local_34 = this->bucketCount - 1;
  pVStack_50 = *value_local;
  local_48 = value_local[1];
  key_00.begin = (char *)value_local[0];
  key_00.end = (char *)value_local[1];
  local_38 = InplaceStrHasher::operator()(&local_39,key_00);
  local_38 = local_38 & local_34;
  item._4_4_ = 0;
  while( true ) {
    if (this->bucketCount <= item._4_4_) {
      __assert_fail("!\"couldn\'t insert node\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                    ,0x5b,
                    "void SmallDenseMap<InplaceStr, VariableData *, InplaceStrHasher, 128>::insert(const Key &, const Value &) [Key = InplaceStr, Value = VariableData *, Hasher = InplaceStrHasher, N = 128]"
                   );
    }
    pNVar1 = this->data;
    uVar3 = (ulong)local_38;
    local_60 = pNVar1 + uVar3;
    InplaceStr::InplaceStr(&local_70);
    bVar2 = InplaceStr::operator==(&pNVar1[uVar3].key,&local_70);
    if (bVar2) break;
    bVar2 = InplaceStr::operator==(&local_60->key,(InplaceStr *)value_local);
    if (bVar2) {
      local_60->value = *local_20;
      return;
    }
    local_38 = local_38 + item._4_4_ + 1 & local_34;
    item._4_4_ = item._4_4_ + 1;
  }
  (local_60->key).begin = (char *)*value_local;
  (local_60->key).end = (char *)value_local[1];
  local_60->value = *local_20;
  this->count = this->count + 1;
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}